

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void bfgs_iter_start<dense_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  weight *pwVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  *origin = 0;
  pwVar2 = weights->_begin;
  if (pwVar2 != pwVar2 + weights->_weight_mask + 1) {
    uVar3 = weights->_stride_shift;
    lVar7 = 0;
    do {
      iVar6 = b->mem_stride;
      lVar5 = ((ulong)(lVar7 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar6;
      iVar4 = *origin;
      if (0 < b->m) {
        mem[lVar5 + (iVar4 + 1) % iVar6] = *(float *)((long)pwVar2 + lVar7);
        iVar4 = *origin;
        iVar6 = b->mem_stride;
      }
      fVar1 = *(float *)((long)pwVar2 + lVar7 + 4);
      mem[lVar5 + iVar4 % iVar6] = fVar1;
      *(float *)((long)pwVar2 + lVar7 + 8) = -*(float *)((long)pwVar2 + lVar7 + 0xc) * fVar1;
      *(undefined4 *)((long)pwVar2 + lVar7 + 4) = 0;
      lVar7 = lVar7 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar2 + lVar7) != weights->_begin + weights->_weight_mask + 1);
  }
  *lastj = 0;
  if (all->quiet == false) {
    bfgs_iter_start<dense_parameters>();
  }
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}